

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O3

void __thiscall Inject::bind_scope_none::test_method(bind_scope_none *this)

{
  element_type *peVar1;
  ptr_type *ppVar2;
  component<Inject::impl1> xx;
  component<Inject::service> x;
  injected<Inject::service> second;
  injected<Inject::service> first;
  provides<Inject::service> xxx;
  context<0> c;
  component<Inject::impl1> local_140;
  component<Inject::service> local_138;
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110;
  _Base_ptr local_108;
  shared_count sStack_100;
  provides<Inject::service> local_f8;
  char *local_f0;
  _Base_ptr local_e8;
  char *local_e0;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  context<0> *local_c8;
  char *local_c0;
  context<0> *local_b8;
  context<0> local_b0;
  undefined **local_40;
  undefined1 local_38;
  undefined8 *local_30;
  char **local_28;
  
  inject::context<0>::component<Inject::service>::component(&local_138);
  inject::context<0>::component<Inject::impl1>::component(&local_140);
  inject::context<0>::component<Inject::impl1>::provides<Inject::service>::provides(&local_f8);
  local_b0._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._bindings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b0._vptr_context = (_func_int **)&PTR__context_00163e68;
  local_b0._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._bindings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._singletons._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b0._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._singletons._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0._parent = inject::context<0>::head()::_head;
  inject::context<0>::head()::_head = &local_b0;
  inject::context<0>::current()::_current = inject::context<0>::head()::_head;
  local_b0._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._bindings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b0._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._singletons._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  inject::context<0>::bind<Inject::service,Inject::impl1,(inject::component_scope)0>
            (inject::context<0>::head()::_head);
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::service>((context<0> *)local_120);
  inject::context<0>::get_current();
  inject::context<0>::instance<Inject::service>((context<0> *)local_130);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_b8 = (context<0> *)0x15209c;
  local_d0 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = (context<0> *)&boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x5f);
  ppVar2 = inject::context<0>::injected<Inject::service>::ptr
                     ((injected<Inject::service> *)local_120);
  peVar1 = ppVar2->px;
  ppVar2 = inject::context<0>::injected<Inject::service>::ptr
                     ((injected<Inject::service> *)local_130);
  local_110 = peVar1 != ppVar2->px;
  local_108 = (_Base_ptr)0x0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_28 = &local_e0;
  local_e0 = "first.get() != second.get()";
  local_d8 = (_Base_ptr)0x1520f3;
  local_38 = 0;
  local_40 = &PTR__lazy_ostream_00163ff8;
  local_30 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_e8 = (_Base_ptr)0x15209c;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_100);
  boost::detail::shared_count::~shared_count((shared_count *)(local_130 + 8));
  boost::detail::shared_count::~shared_count((shared_count *)(local_120 + 8));
  local_b0._vptr_context = (_func_int **)&PTR__context_00163e68;
  inject::context<0>::head()::_head = local_b0._parent;
  inject::context<0>::current()::_current = local_b0._parent;
  std::
  _Rb_tree<long,_std::pair<const_long,_boost::shared_ptr<void>_>,_std::_Select1st<std::pair<const_long,_boost::shared_ptr<void>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_boost::shared_ptr<void>_>_>_>
  ::~_Rb_tree(&local_b0._singletons._M_t);
  std::
  _Rb_tree<long,_std::pair<const_long,_inject::binding>,_std::_Select1st<std::pair<const_long,_inject::binding>_>,_std::less<long>,_std::allocator<std::pair<const_long,_inject::binding>_>_>
  ::~_Rb_tree(&local_b0._bindings._M_t);
  inject::context<0>::component<Inject::impl1>::~component(&local_140);
  inject::context<0>::component<Inject::service>::~component(&local_138);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bind_scope_none)
{
    context<>::component<service> x;
    context<>::component<impl1> xx;
    context<>::component<impl1>::provides<service> xxx;

    context<> c;
    c.bind<service, impl1, scope_none>();

    context<>::injected<service> first;
    context<>::injected<service> second;
    BOOST_CHECK(first.get() != second.get());
}